

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.h
# Opt level: O0

void builder_move_assign_after_releaseraw_test<TestHeapBuilder>(TestHeapBuilder *b1)

{
  Color color;
  bool val;
  SizeT SVar1;
  string local_100;
  SizeT local_e0;
  offset_type local_dc;
  SizeT src_size;
  Offset<MyGame::Example::Monster> root_offset2;
  undefined1 local_c8 [8];
  TestHeapBuilder src;
  undefined1 local_40 [8];
  shared_ptr<unsigned_char> raw;
  uint8_t *rr;
  size_t offset;
  size_t size;
  TestHeapBuilder *pTStack_10;
  Offset<MyGame::Example::Monster> root_offset1;
  TestHeapBuilder *b1_local;
  
  pTStack_10 = b1;
  size._0_4_ = populate1(&b1->super_FlatBufferBuilder);
  size._4_4_ = size._0_4_;
  flatbuffers::FlatBufferBuilderImpl<false>::Finish<MyGame::Example::Monster>
            (&b1->super_FlatBufferBuilder,size._0_4_,(char *)0x0);
  raw.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       flatbuffers::FlatBufferBuilderImpl<false>::ReleaseRaw
                 (&b1->super_FlatBufferBuilder,&offset,(size_t *)&rr);
  src.super_FlatBufferBuilder.string_pool = (StringOffsetMap *)offset;
  std::shared_ptr<unsigned_char>::
  shared_ptr<unsigned_char,builder_move_assign_after_releaseraw_test<TestHeapBuilder>(TestHeapBuilder)::_lambda(unsigned_char*)_1_,void>
            ((shared_ptr<unsigned_char> *)local_40,
             (uchar *)raw.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi,(anon_class_8_1_89918cff_for__M_tp)offset);
  TestHeapBuilder::TestHeapBuilder((TestHeapBuilder *)local_c8);
  local_dc = (offset_type)populate2((FlatBufferBuilder *)local_c8);
  src_size = local_dc;
  flatbuffers::FlatBufferBuilderImpl<false>::Finish<MyGame::Example::Monster>
            ((FlatBufferBuilderImpl<false> *)local_c8,(Offset<MyGame::Example::Monster>)local_dc,
             (char *)0x0);
  local_e0 = flatbuffers::FlatBufferBuilderImpl<false>::GetSize
                       ((FlatBufferBuilderImpl<false> *)local_c8);
  TestHeapBuilder::operator=(b1,(TestHeapBuilder *)local_c8);
  SVar1 = flatbuffers::FlatBufferBuilderImpl<false>::GetSize(&b1->super_FlatBufferBuilder);
  TestEq<unsigned_int,unsigned_int>
            (SVar1,local_e0,"\'b1.GetSize()\' != \'src_size\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
             ,0x48,
             "void builder_move_assign_after_releaseraw_test(Builder) [Builder = TestHeapBuilder]");
  m2_name_abi_cxx11_();
  color = m2_color();
  val = release_n_verify(&b1->super_FlatBufferBuilder,&local_100,color);
  TestEq<bool,bool>(true,val,"\'true\' != \'release_n_verify(b1, m2_name(), m2_color())\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
                    ,0x49,
                    "void builder_move_assign_after_releaseraw_test(Builder) [Builder = TestHeapBuilder]"
                   );
  std::__cxx11::string::~string((string *)&local_100);
  SVar1 = flatbuffers::FlatBufferBuilderImpl<false>::GetSize
                    ((FlatBufferBuilderImpl<false> *)local_c8);
  TestEq<unsigned_int,int>
            (SVar1,0,"\'src.GetSize()\' != \'0\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
             ,0x4a,
             "void builder_move_assign_after_releaseraw_test(Builder) [Builder = TestHeapBuilder]");
  TestHeapBuilder::~TestHeapBuilder((TestHeapBuilder *)local_c8);
  std::shared_ptr<unsigned_char>::~shared_ptr((shared_ptr<unsigned_char> *)local_40);
  return;
}

Assistant:

void builder_move_assign_after_releaseraw_test(Builder b1) {
  auto root_offset1 = populate1(b1);
  b1.Finish(root_offset1);
  size_t size, offset;

  uint8_t *rr = b1.ReleaseRaw(size, offset);
  std::shared_ptr<uint8_t> raw(
      rr, [size](uint8_t *ptr) {
        flatbuffers::DefaultAllocator::dealloc(ptr, size);
      });
  Builder src;
  auto root_offset2 = populate2(src);
  src.Finish(root_offset2);
  auto src_size = src.GetSize();
  // Move into a released builder.
  b1 = std::move(src);
  TEST_EQ_FUNC(b1.GetSize(), src_size);
  TEST_ASSERT_FUNC(release_n_verify(b1, m2_name(), m2_color()));
  TEST_EQ_FUNC(src.GetSize(), 0);
}